

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolverTypes.h
# Opt level: O2

void __thiscall Gluco::Clause::calcAbstraction(Clause *this)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  
  uVar1 = *(ulong *)&this->header;
  if ((uVar1 & 8) != 0) {
    uVar2 = 0;
    uVar4 = (uint)(uVar1 >> 0x20);
    uVar3 = 0;
    if (uVar4 != 0 && -1 < (long)uVar1) {
      uVar3 = (ulong)uVar4;
    }
    uVar4 = 0;
    for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
      uVar4 = uVar4 | 1 << ((byte)(&this[1].header.field_0x0)[uVar2 * 4] >> 1 & 0x1f);
    }
    *(uint *)(&this[1].header.field_0x0 + (uVar1 >> 0x20) * 4) = uVar4;
    return;
  }
  __assert_fail("header.has_extra",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/glucose/SolverTypes.h"
                ,0xaa,"void Gluco::Clause::calcAbstraction()");
}

Assistant:

void calcAbstraction() {
        assert(header.has_extra);
        uint32_t abstraction = 0;
        for (int i = 0; i < size(); i++)
            abstraction |= 1 << (var(data[i].lit) & 31);
        data[header.size].abs = abstraction;  }